

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

size_t __thiscall
MemoryLeakDetectorTable::getTotalLeaks(MemoryLeakDetectorTable *this,MemLeakPeriod period)

{
  size_t sVar1;
  undefined4 in_ESI;
  int i;
  size_t total_leaks;
  undefined4 local_1c;
  size_t sVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  sVar2 = 0;
  for (local_1c = 0; local_1c < 0x49; local_1c = local_1c + 1) {
    sVar1 = MemoryLeakDetectorList::getTotalLeaks
                      ((MemoryLeakDetectorList *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       (MemLeakPeriod)(sVar2 >> 0x20));
    sVar2 = sVar1 + sVar2;
  }
  return sVar2;
}

Assistant:

size_t MemoryLeakDetectorTable::getTotalLeaks(MemLeakPeriod period)
{
    size_t total_leaks = 0;
    for (int i = 0; i < hash_prime; i++)
        total_leaks += table_[i].getTotalLeaks(period);
    return total_leaks;
}